

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O3

int Bac_ManFindRealIndex(Bac_Ntk_t *p,int iObj)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = Bac_ObjName(p,iObj);
  if ((iObj < 0) || ((p->vType).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  uVar6 = (uint)(byte)(p->vType).pArray[(uint)iObj];
  if ((9 < uVar6) || ((0x30cU >> (uVar6 & 0x1f) & 1) == 0)) {
    __assert_fail("Bac_ObjIsCi(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0xff,"int Bac_ManFindRealIndex(Bac_Ntk_t *, int)");
  }
  if (uVar5 != 0) {
    if ((int)uVar5 < 0) {
LAB_003a3776:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x13e,"int Abc_Lit2Att2(int)");
    }
    if ((uVar5 & 3) == 3) {
      uVar6 = uVar5 >> 2;
      uVar5 = Bac_ObjName(p,iObj - uVar6);
      if (uVar5 == 0) goto LAB_003a3757;
      if ((int)uVar5 < 0) goto LAB_003a3776;
    }
    else {
      if ((uVar5 & 3) == 0) {
        __assert_fail("Bac_NameType(NameId) != BAC_NAME_BIN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                      ,0x100,"int Bac_ManFindRealIndex(Bac_Ntk_t *, int)");
      }
      uVar6 = 0;
    }
    if ((uVar5 & 3) != 1) {
      if ((uVar5 & 3) != 2) {
        __assert_fail("Bac_NameType(NameId) == BAC_NAME_WORD",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                      ,0x105,"int Bac_ManFindRealIndex(Bac_Ntk_t *, int)");
      }
      uVar4 = (uVar5 >> 2) * 3;
      uVar1 = (p->vInfo).nSize;
      if (uVar1 == uVar4 || SBORROW4(uVar1,uVar4) != (int)(uVar1 + (uVar5 >> 2) * -3) < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar3 = (p->vInfo).pArray;
      iVar2 = piVar3[(ulong)uVar4 + 1];
      if (iVar2 < 0) {
        __assert_fail("a[1]>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0xf8,"int Bac_NtkInfoIndex(Bac_Ntk_t *, int, int)");
      }
      uVar5 = -uVar6;
      if (iVar2 < piVar3[(ulong)uVar4 + 2]) {
        uVar5 = uVar6;
      }
      uVar6 = uVar5 + iVar2;
    }
    return uVar6;
  }
LAB_003a3757:
  __assert_fail("n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                ,0x107,"Bac_NameType_t Bac_NameType(int)");
}

Assistant:

static inline int Bac_ManFindRealIndex( Bac_Ntk_t * p, int iObj )
{
    int iBit = 0, NameId = Bac_ObjName(p, iObj);
    assert( Bac_ObjIsCi(p, iObj) );
    assert( Bac_NameType(NameId) != BAC_NAME_BIN );
    if ( Bac_NameType(NameId) == BAC_NAME_INDEX )
        NameId = Bac_ObjName(p, iObj - (iBit = Abc_Lit2Var2(NameId)));
    if ( Bac_NameType(NameId) == BAC_NAME_INFO )
        return Bac_NtkInfoIndex(p, Abc_Lit2Var2(NameId), iBit);
    assert( Bac_NameType(NameId) == BAC_NAME_WORD );
    return iBit;
}